

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O0

void __thiscall
soplex::LPColSetBase<double>::add(LPColSetBase<double> *this,LPColSetBase<double> *newset)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  int *piVar6;
  long in_RSI;
  long in_RDI;
  int j;
  int i;
  double in_stack_ffffffffffffff98;
  LPColSetBase<double> *in_stack_ffffffffffffffa0;
  SVSetBase<double> *in_stack_ffffffffffffffb8;
  SVSetBase<double> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  VectorBase<double> *in_stack_ffffffffffffffd0;
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = num((LPColSetBase<double> *)0x236e1d);
  SVSetBase<double>::add<double>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  iVar2 = num((LPColSetBase<double> *)0x236e3a);
  iVar3 = VectorBase<double>::dim((VectorBase<double> *)0x236e4c);
  if (iVar3 < iVar2) {
    num((LPColSetBase<double> *)0x236e70);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x18,0));
    num((LPColSetBase<double> *)0x236e99);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x18,0));
    lVar4 = in_RDI + 0x98;
    num((LPColSetBase<double> *)0x236ec2);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffffd0,(int)((ulong)lVar4 >> 0x20),SUB81((ulong)lVar4 >> 0x18,0));
    num((LPColSetBase<double> *)0x236eeb);
    DataArray<int>::reSize
              ((DataArray<int> *)in_stack_ffffffffffffffa0,
               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  local_18 = 0;
  while( true ) {
    iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    iVar2 = num((LPColSetBase<double> *)0x236f11);
    if (iVar2 <= local_14) break;
    pdVar5 = lower(in_stack_ffffffffffffffa0,iVar3);
    in_stack_ffffffffffffff98 = *pdVar5;
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    *pdVar5 = in_stack_ffffffffffffff98;
    pdVar5 = upper(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    in_stack_ffffffffffffffa0 = (LPColSetBase<double> *)*pdVar5;
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    *pdVar5 = (double)in_stack_ffffffffffffffa0;
    pdVar5 = maxObj(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    dVar1 = *pdVar5;
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    *pdVar5 = dVar1;
    piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RSI + 0xb0),local_18);
    iVar2 = *piVar6;
    piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xb0),local_14);
    *piVar6 = iVar2;
    local_14 = local_14 + 1;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void add(const LPColSetBase<R>& newset)
   {
      int i = num();

      SVSetBase<R>::add(newset);

      if(num() > low.dim())
      {
         low.reDim(num());
         up.reDim(num());
         object.reDim(num());
         scaleExp.reSize(num());
      }

      for(int j = 0; i < num(); ++i, ++j)
      {
         low[i] = newset.lower(j);
         up[i] = newset.upper(j);
         object[i] = newset.maxObj(j);
         scaleExp[i] = newset.scaleExp[j];
      }
   }